

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O0

int Pla_ManHashDistance1(Pla_Man_t *p)

{
  uint n;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Tab_Man_t *pTab_00;
  Vec_Int_t *vVec2;
  uint local_44;
  int Count;
  int ValueCopy;
  int Value;
  int Lit;
  int k;
  int i;
  int nBits;
  Vec_Int_t *vCubeCopy;
  Vec_Int_t *vCube;
  Tab_Man_t *pTab;
  Pla_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(p->nIns);
  n = Pla_ManCubeNum(p);
  iVar1 = Abc_Base2Log(n);
  local_44 = 0;
  if (0x1a < iVar1 + 2) {
    __assert_fail("nBits <= 26",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                  ,0xb9,"int Pla_ManHashDistance1(Pla_Man_t *)");
  }
  pTab_00 = Tab_ManAlloc(iVar1 + 2,p);
  Pla_ManConvertFromBits(p);
  Pla_ManHashCubes(p,pTab_00);
  Lit = 0;
  while( true ) {
    iVar1 = Vec_WecSize(&p->vCubeLits);
    if (iVar1 <= Lit) {
      Vec_IntFree(p_00);
      Tab_ManFree(pTab_00);
      if ((local_44 & 1) != 0) {
        __assert_fail("!(Count & 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                      ,0xd1,"int Pla_ManHashDistance1(Pla_Man_t *)");
      }
      return (int)local_44 / 2;
    }
    vVec2 = Vec_WecEntry(&p->vCubeLits,Lit);
    Vec_IntClear(p_00);
    Vec_IntAppend(p_00,vVec2);
    iVar1 = Vec_IntEntry(&p->vHashes,Lit);
    Count = iVar1;
    for (Value = 0; iVar2 = Vec_IntSize(p_00), Value < iVar2; Value = Value + 1) {
      iVar2 = Vec_IntEntry(p_00,Value);
      iVar3 = Abc_LitNot(iVar2);
      iVar3 = Pla_HashValue(iVar3);
      iVar4 = Pla_HashValue(iVar2);
      iVar3 = (iVar3 - iVar4) + Count;
      iVar4 = Abc_LitNot(iVar2);
      Vec_IntWriteEntry(p_00,Value,iVar4);
      iVar4 = Tab_ManHashLookup(pTab_00,iVar3,p_00);
      local_44 = iVar4 + local_44;
      iVar4 = Abc_LitNot(iVar2);
      iVar4 = Pla_HashValue(iVar4);
      iVar5 = Pla_HashValue(iVar2);
      Count = iVar3 - (iVar4 - iVar5);
      Vec_IntWriteEntry(p_00,Value,iVar2);
    }
    if (Count != iVar1) break;
    Lit = Lit + 1;
  }
  __assert_fail("Value == ValueCopy",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                ,0xcd,"int Pla_ManHashDistance1(Pla_Man_t *)");
}

Assistant:

int Pla_ManHashDistance1( Pla_Man_t * p )
{
    Tab_Man_t * pTab;
    Vec_Int_t * vCube;
    Vec_Int_t * vCubeCopy = Vec_IntAlloc( p->nIns );
    int nBits = Abc_Base2Log( Pla_ManCubeNum(p) ) + 2;
    int i, k, Lit, Value, ValueCopy, Count = 0;
    assert( nBits <= 26 );
    pTab = Tab_ManAlloc( nBits, p );
    Pla_ManConvertFromBits( p );
    Pla_ManHashCubes( p, pTab );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
    {
        Vec_IntClear( vCubeCopy );
        Vec_IntAppend( vCubeCopy, vCube );
        Value = ValueCopy = Vec_IntEntry( &p->vHashes, i );
        Vec_IntForEachEntry( vCubeCopy, Lit, k )
        {
            // create new
            Value += Pla_HashValue(Abc_LitNot(Lit)) - Pla_HashValue(Lit);
            Vec_IntWriteEntry( vCubeCopy, k, Abc_LitNot(Lit) );
            // check the cube
            Count += Tab_ManHashLookup( pTab, Value, vCubeCopy );
            // create old
            Value -= Pla_HashValue(Abc_LitNot(Lit)) - Pla_HashValue(Lit);
            Vec_IntWriteEntry( vCubeCopy, k, Lit );
        }
        assert( Value == ValueCopy );
    }
    Vec_IntFree( vCubeCopy );
    Tab_ManFree( pTab );
    assert( !(Count & 1) );
    return Count/2;
}